

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall
t_st_generator::st_method(t_st_generator *this,ostream *out,string *cls,string *name)

{
  allocator local_99;
  string local_98;
  string local_68;
  string local_48;
  string *local_28;
  string *name_local;
  string *cls_local;
  ostream *out_local;
  t_st_generator *this_local;
  
  local_28 = name;
  name_local = cls;
  cls_local = (string *)out;
  out_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_48,(string *)cls);
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"as yet uncategorized",&local_99);
  st_method(this,out,&local_48,&local_68,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void t_st_generator::st_method(std::ostream& out, string cls, string name) {
  st_method(out, cls, name, "as yet uncategorized");
}